

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::TcpSocket::TcpSocket(TcpSocket *this)

{
  TcpSocket *this_local;
  
  this->_vptr_TcpSocket = (_func_int **)&PTR__TcpSocket_0011fc40;
  this->_inbuf = (char *)0x0;
  this->_readptr = (char *)0x0;
  this->_inbufSize = 0;
  this->_recvSize = 0;
  this->_lastport = 0;
  this->_s = -1;
  std::__cxx11::string::string((string *)&this->_host);
  this->_sslctx = (void *)0x0;
  return;
}

Assistant:

TcpSocket::TcpSocket()
	: _inbuf(NULL)
	, _readptr(NULL)
	, _inbufSize(0)
	, _recvSize(0)
	, _lastport(0)
	, _s(INVALID_SOCKET)
	, _sslctx(NULL)
{
#ifdef MINIHTTP_USE_MBEDTLS
    mbedtls_net_init((mbedtls_net_context*)&_s);
#endif
}